

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.hpp
# Opt level: O1

TerminalInfo * __thiscall plot::TerminalInfo::detect<void>(TerminalInfo *this)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  TerminalMode TVar5;
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  char *__s_00;
  char *pcVar6;
  size_type sVar7;
  long lVar8;
  char (*needle) [8];
  char (*needle_00) [7];
  TerminalMode TVar9;
  bool bVar10;
  string_view haystack;
  string_view haystack_00;
  string_view haystack_01;
  string_view cmd;
  string_view cmd_00;
  string_view terminator;
  string_view terminator_00;
  Color32 c;
  string response;
  undefined4 local_64;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  string local_58;
  size_type local_38;
  
  iVar4 = isatty(this->term_);
  if (iVar4 != 0) {
    __s = getenv("TERM");
    if (__s == (char *)0x0) {
      __s = (char *)0x0;
      this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    }
    else {
      this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)strlen(__s);
    }
    __s_00 = getenv("COLORTERM");
    if (__s_00 == (char *)0x0) {
      __s_00 = (char *)0x0;
      local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
    }
    else {
      local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)strlen(__s_00);
    }
    pcVar6 = getenv("VTE_VERSION");
    if (pcVar6 == (char *)0x0) {
      bVar10 = true;
      pcVar6 = (char *)0x0;
    }
    else {
      bVar10 = *pcVar6 == '\0';
    }
    local_58._M_dataplus._M_p = (pointer)this_00;
    local_58._M_string_length = (size_type)__s;
    local_38 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>
               ::find((basic_string_view<char,_std::char_traits<char>_> *)&local_58,"xterm",0,5);
    if (bVar10) {
      local_58._M_dataplus._M_p = (pointer)local_60;
      local_58._M_string_length = (size_type)__s_00;
      sVar7 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
              find((basic_string_view<char,_std::char_traits<char>_> *)&local_58,"truecolor",0,9);
      bVar10 = true;
      if (sVar7 == 0xffffffffffffffff) {
        local_58._M_dataplus._M_p = (pointer)this_00;
        local_58._M_string_length = (size_type)__s;
        sVar7 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>
                ::find((basic_string_view<char,_std::char_traits<char>_> *)&local_58,"cygwin",0,6);
        if (sVar7 == 0xffffffffffffffff) {
          local_58._M_dataplus._M_p = (pointer)local_60;
          local_58._M_string_length = (size_type)__s_00;
          sVar7 = std::experimental::fundamentals_v1::
                  basic_string_view<char,_std::char_traits<char>_>::find
                            ((basic_string_view<char,_std::char_traits<char>_> *)&local_58,"cygwin",
                             0,6);
          if (sVar7 == 0xffffffffffffffff) {
            needle = (char (*) [8])0x7;
            local_58._M_dataplus._M_p = (pointer)this_00;
            local_58._M_string_length = (size_type)__s;
            sVar7 = std::experimental::fundamentals_v1::
                    basic_string_view<char,_std::char_traits<char>_>::find
                              ((basic_string_view<char,_std::char_traits<char>_> *)&local_58,
                               "konsole",0,7);
            if (sVar7 == 0xffffffffffffffff) {
              haystack._M_str = "konsole";
              haystack._M_len = (size_t)__s_00;
              bVar10 = detail::contains<char_const(&)[8]>
                                 ((detail *)local_60->_M_local_buf,haystack,needle);
            }
          }
        }
      }
    }
    else {
      bVar10 = true;
      if (*pcVar6 < '4') {
        if (*pcVar6 == '3') {
          bVar10 = '5' < pcVar6[1];
        }
        else {
          bVar10 = false;
        }
      }
    }
    bVar2 = true;
    if (bVar10 == false) {
      local_58._M_dataplus._M_p = (pointer)this_00;
      local_58._M_string_length = (size_type)__s;
      sVar7 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
              find((basic_string_view<char,_std::char_traits<char>_> *)&local_58,"256",0,3);
      bVar2 = sVar7 != 0xffffffffffffffff ||
              local_60 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    }
    TVar9 = Ansi;
    if ((local_38 == 0xffffffffffffffff) && (!bVar2)) {
      local_58._M_dataplus._M_p = (pointer)this_00;
      local_58._M_string_length = (size_type)__s;
      sVar7 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
              find((basic_string_view<char,_std::char_traits<char>_> *)&local_58,"screen",0,6);
      if (sVar7 == 0xffffffffffffffff) {
        local_58._M_dataplus._M_p = (pointer)this_00;
        local_58._M_string_length = (size_type)__s;
        sVar7 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>
                ::find((basic_string_view<char,_std::char_traits<char>_> *)&local_58,"vt100",0,5);
        if (sVar7 == 0xffffffffffffffff) {
          local_58._M_dataplus._M_p = (pointer)this_00;
          local_58._M_string_length = (size_type)__s;
          sVar7 = std::experimental::fundamentals_v1::
                  basic_string_view<char,_std::char_traits<char>_>::find
                            ((basic_string_view<char,_std::char_traits<char>_> *)&local_58,"color",0
                             ,5);
          if (sVar7 == 0xffffffffffffffff) {
            needle_00 = (char (*) [7])0x4;
            local_58._M_dataplus._M_p = (pointer)this_00;
            local_58._M_string_length = (size_type)__s;
            sVar7 = std::experimental::fundamentals_v1::
                    basic_string_view<char,_std::char_traits<char>_>::find
                              ((basic_string_view<char,_std::char_traits<char>_> *)&local_58,"ansi",
                               0,4);
            if (sVar7 == 0xffffffffffffffff) {
              haystack_00._M_str = "cygwin";
              haystack_00._M_len = (size_t)__s;
              bVar3 = detail::contains<char_const(&)[7]>
                                ((detail *)this_00->_M_local_buf,haystack_00,needle_00);
              if (!bVar3) {
                haystack_01._M_str = "linux";
                haystack_01._M_len = (size_t)__s;
                bVar3 = detail::contains<char_const(&)[6]>
                                  ((detail *)this_00->_M_local_buf,haystack_01,
                                   (char (*) [6])needle_00);
                TVar9 = (uint)bVar3 * 2;
              }
            }
          }
        }
      }
    }
    if (this->mode == None) {
      if (bVar2) {
        TVar9 = Ansi256;
      }
      TVar5 = Iso24bit;
      if (bVar10 == false) {
        TVar5 = TVar9;
      }
      this->mode = TVar5;
    }
    if (local_38 != 0xffffffffffffffff) {
      fVar1 = (this->foreground_color).r;
      if (((((fVar1 == 0.9) && (!NAN(fVar1))) && (fVar1 = (this->foreground_color).g, fVar1 == 0.9))
          && ((!NAN(fVar1) && (fVar1 = (this->foreground_color).b, fVar1 == 0.9)))) &&
         ((!NAN(fVar1) && ((fVar1 = (this->foreground_color).a, fVar1 == 1.0 && (!NAN(fVar1))))))) {
        cmd._M_str = "\x1b]10;?\x1b\\";
        cmd._M_len = 8;
        terminator._M_str = "\a\\";
        terminator._M_len = 2;
        query<void>(&local_58,this,cmd,terminator);
        if ((char *)local_58._M_string_length != (char *)0x0) {
          lVar8 = std::__cxx11::string::find((char *)&local_58,0x10525d,0);
          if (lVar8 != -1) {
            local_64 = 0xffffffff;
            iVar4 = __isoc99_sscanf(local_58._M_dataplus._M_p + lVar8 + 4,
                                    "%2hhx%*2x/%2hhx%*2x/%2hhx%*2x",&local_64,(long)&local_64 + 1,
                                    (long)&local_64 + 2);
            if (iVar4 == 3) {
              (this->foreground_color).r = (float)(local_64 & 0xff) / 255.0;
              (this->foreground_color).g = (float)(local_64 >> 8 & 0xff) / 255.0;
              (this->foreground_color).b = (float)(local_64 >> 0x10 & 0xff) / 255.0;
              (this->foreground_color).a = (float)(local_64 >> 0x18) / 255.0;
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      if (((((local_38 != 0xffffffffffffffff) && (fVar1 = (this->background_color).r, fVar1 == 0.0))
           && (!NAN(fVar1))) &&
          (((fVar1 = (this->background_color).g, fVar1 == 0.0 && (!NAN(fVar1))) &&
           ((fVar1 = (this->background_color).b, fVar1 == 0.0 &&
            ((!NAN(fVar1) && (fVar1 = (this->background_color).a, fVar1 == 1.0)))))))) &&
         (!NAN(fVar1))) {
        cmd_00._M_str = "\x1b]11;?\x1b\\";
        cmd_00._M_len = 8;
        terminator_00._M_str = "\a\\";
        terminator_00._M_len = 2;
        query<void>(&local_58,this,cmd_00,terminator_00);
        if ((char *)local_58._M_string_length != (char *)0x0) {
          lVar8 = std::__cxx11::string::find((char *)&local_58,0x10525d,0);
          if (lVar8 != -1) {
            local_64 = 0xff000000;
            iVar4 = __isoc99_sscanf(local_58._M_dataplus._M_p + lVar8 + 4,
                                    "%2hhx%*2x/%2hhx%*2x/%2hhx%*2x",&local_64,(long)&local_64 + 1,
                                    (long)&local_64 + 2);
            if (iVar4 == 3) {
              (this->background_color).r = (float)(local_64 & 0xff) / 255.0;
              (this->background_color).g = (float)(local_64 >> 8 & 0xff) / 255.0;
              (this->background_color).b = (float)(local_64 >> 0x10 & 0xff) / 255.0;
              (this->background_color).a = (float)(local_64 >> 0x18) / 255.0;
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return this;
}

Assistant:

TerminalInfo& TerminalInfo::detect() {
    if (!is_terminal())
        return *this;

    string_view name, colorterm, vte_version;

    auto tmp = std::getenv(u8"TERM");
    if (tmp) name = tmp;

    tmp = std::getenv(u8"COLORTERM");
    if (tmp) colorterm = tmp;

    tmp = std::getenv(u8"VTE_VERSION");
    if (tmp) vte_version = tmp;

    bool xterm_like = detail::contains(name, u8"xterm");

    bool has_truecolor =
        !vte_version.empty()
            ? (vte_version[0] > '3' || (vte_version[0] == '3' && vte_version[1] >= '6')) // VTE >= 0.36 supports true color
            : detail::contains(colorterm, u8"truecolor") ||
              detail::contains(name, u8"cygwin") ||
              detail::contains(colorterm, u8"cygwin") ||
              detail::contains(name, u8"konsole") ||
              detail::contains(colorterm, u8"konsole");

    bool has_256color = has_truecolor ||
                        detail::contains(name, u8"256") ||
                        !colorterm.empty();

    bool has_ansi = has_256color ||
                    xterm_like ||
                    detail::contains(name, u8"screen") ||
                    detail::contains(name, u8"vt100") ||
                    detail::contains(name, u8"color") ||
                    detail::contains(name, u8"ansi") ||
                    detail::contains(name, u8"cygwin") ||
                    detail::contains(name, u8"linux");

    if (mode == TerminalMode::None)
        mode = has_truecolor ? TerminalMode::Iso24bit
                             : has_256color ? TerminalMode::Ansi256
                                            : has_ansi ? TerminalMode::Ansi
                                                       : TerminalMode::None;

    if (xterm_like && foreground_color == Color(0.9f, 0.9f, 0.9f, 1)) {
        auto response = query(u8"\x1b]10;?\x1b\\", u8"\a\\");
        if (!response.empty()) {
            auto pos = response.find(u8"rgb:");
            if (pos != std::string::npos) {
                pos += 4;
                Color32 c = { 255, 255, 255, 255 };
                if (sscanf(response.c_str() + pos, u8"%2hhx%*2x/%2hhx%*2x/%2hhx%*2x", &c.r, &c.g, &c.b) == 3)
                    foreground_color = c;
            }
        }
    }

    if (xterm_like && background_color == Color(0, 0, 0, 1)) {
        auto response = query(u8"\x1b]11;?\x1b\\", u8"\a\\");
        if (!response.empty()) {
            auto pos = response.find(u8"rgb:");
            if (pos != std::string::npos) {
                pos += 4;
                Color32 c = { 0, 0, 0, 255 };
                if (sscanf(response.c_str() + pos, u8"%2hhx%*2x/%2hhx%*2x/%2hhx%*2x", &c.r, &c.g, &c.b) == 3)
                    background_color = c;
            }
        }
    }

    return *this;
}